

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O2

void canvas_iemguis(_glist *gl,t_symbol *guiobjname)

{
  _binbuf *x;
  t_symbol *sel;
  _glist *extraout_RAX;
  _glist *extraout_RAX_00;
  _glist *p_Var1;
  _glist *x_00;
  void *data;
  int nobj;
  int indx;
  int connectme;
  int ypix;
  int xpix;
  t_atom at;
  
  x = binbuf_new();
  canvas_howputnew(gl,&connectme,&xpix,&ypix,&indx,&nobj);
  sel = gensym("editmode");
  pd_vmess((t_pd *)gl,sel,"i",1);
  glist_noselect(gl);
  at.a_type = A_SYMBOL;
  at.a_w.w_symbol = guiobjname;
  binbuf_restore(x,1,&at);
  canvas_objtext(gl,xpix / gl->gl_zoom,ypix / gl->gl_zoom,0,1,x);
  if (connectme == 0) {
    p_Var1 = glist_getcanvas((_glist *)&connectme);
    canvas_startmotion(p_Var1);
    p_Var1 = extraout_RAX_00;
  }
  else {
    canvas_connect(gl,(float)indx,0.0,(float)nobj,0.0);
    p_Var1 = extraout_RAX;
  }
  p_Var1 = glist_getcanvas(p_Var1);
  x_00 = glist_getcanvas(p_Var1);
  data = canvas_undo_set_create(x_00);
  canvas_undo_add(p_Var1,UNDO_CREATE,"create",data);
  return;
}

Assistant:

void canvas_iemguis(t_glist *gl, t_symbol *guiobjname)
{
    t_atom at;
    t_binbuf *b = binbuf_new();

    int connectme, xpix, ypix, indx, nobj;
    canvas_howputnew(gl, &connectme, &xpix, &ypix, &indx, &nobj);

    pd_vmess(&gl->gl_pd, gensym("editmode"), "i", 1);

    glist_noselect(gl);
    SETSYMBOL(&at, guiobjname);
    binbuf_restore(b, 1, &at);

    canvas_objtext(gl, xpix/gl->gl_zoom, ypix/gl->gl_zoom, 0, 1, b);
    if(connectme)
        canvas_connect(gl, indx, 0, nobj, 0);
    else canvas_startmotion(glist_getcanvas(gl));
    canvas_undo_add(glist_getcanvas(gl), UNDO_CREATE, "create",
        (void *)canvas_undo_set_create(glist_getcanvas(gl)));
}